

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QDateTimeEdit::fixup(QDateTimeEdit *this,QString *input)

{
  QDateTimeEditPrivate *pQVar1;
  QLineEdit *in_RDI;
  long in_FS_OFFSET;
  undefined1 unaff_retaddr;
  State *in_stack_00000008;
  QDateTimeEditPrivate *d;
  QDateTime value;
  int copy;
  State state;
  QString *in_stack_ffffffffffffffa8;
  undefined1 local_30 [24];
  undefined1 *local_18;
  int local_10;
  undefined4 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QDateTimeEdit *)0x55f2df);
  local_c = 0xaaaaaaaa;
  local_10 = QLineEdit::cursorPosition(in_RDI);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  QDateTimeEditPrivate::validateAndInterpret
            ((QDateTimeEditPrivate *)this,input,(int *)d,in_stack_00000008,(bool)unaff_retaddr);
  if ((pQVar1->super_QAbstractSpinBoxPrivate).correctionMode == CorrectToNearestValue) {
    (**(code **)(*(long *)&in_RDI->super_QWidget + 0x1d8))(local_30,in_RDI,&local_18);
    QString::operator=((QString *)in_RDI,in_stack_ffffffffffffffa8);
    QString::~QString((QString *)0x55f370);
  }
  QDateTime::~QDateTime((QDateTime *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::fixup(QString &input) const
{
    Q_D(const QDateTimeEdit);
    QValidator::State state;
    int copy = d->edit->cursorPosition();

    QDateTime value = d->validateAndInterpret(input, copy, state, true);
    // CorrectToPreviousValue correction is handled by QAbstractSpinBox.
    // The value might not match the input if the input represents a date-time
    // skipped over by its time representation, such as a spring-forward.
    if (d->correctionMode == QAbstractSpinBox::CorrectToNearestValue)
        input = textFromDateTime(value);
}